

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O2

vector<long,_std::allocator<long>_> * __thiscall
fasttext::Dictionary::getCounts
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,Dictionary *this,
          entry_type type)

{
  pointer peVar1;
  entry *w;
  pointer peVar2;
  
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  peVar1 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (peVar2 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>
                ._M_impl.super__Vector_impl_data._M_start; peVar2 != peVar1; peVar2 = peVar2 + 1) {
    if (peVar2->type == type) {
      std::vector<long,_std::allocator<long>_>::push_back(__return_storage_ptr__,&peVar2->count);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int64_t> Dictionary::getCounts(entry_type type) const {
  std::vector<int64_t> counts;
  for (auto& w : words_) {
    if (w.type == type) {
      counts.push_back(w.count);
    }
  }
  return counts;
}